

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_ellbvp.h
# Opt level: O3

ElemMat * __thiscall
lf::uscalfe::
MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::base::PredicateTrue>
::Eval(ElemMat *__return_storage_ptr__,
      MassEdgeMatrixProvider<double,_lf::mesh::utils::MeshFunctionConstant<double>,_lf::base::PredicateTrue>
      *this,Entity *edge)

{
  PrecomputedScalarReferenceFiniteElement<double> *this_00;
  PointerType pdVar1;
  pointer pcVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  size_type sVar7;
  size_type sVar8;
  long *plVar9;
  QuadRule *pQVar10;
  CoeffReturnType pdVar11;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar12;
  ostream *poVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ActualDstType actualDst;
  double __tmp;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  VectorXd determinants;
  vector<double,_std::allocator<double>_> gammaval;
  stringstream ss;
  scalar_product_op<double,_double> local_2f1;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  variable_if_dynamic<long,__1> local_2d0;
  variable_if_dynamic<long,__1> vStack_2c8;
  Index local_2c0;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  variable_if_dynamic<long,__1> local_298;
  variable_if_dynamic<long,__1> vStack_290;
  Index local_288;
  double local_280;
  void *local_278;
  ulong local_270;
  undefined1 local_268 [32];
  variable_if_dynamic<long,__1> local_248;
  variable_if_dynamic<long,__1> vStack_240;
  Index local_238;
  PointerType local_230;
  variable_if_dynamic<long,__1> vStack_228;
  size_type local_220;
  XprTypeNested pMStack_218;
  variable_if_dynamic<long,__1> local_210;
  variable_if_dynamic<long,__1> vStack_208;
  Index local_200;
  vector<double,_std::allocator<double>_> local_1f0;
  scalar_constant_op<double> local_1d8;
  undefined1 local_1d0 [16];
  scalar_constant_op<double> local_1c0;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_48;
  undefined4 extraout_var;
  
  iVar6 = (*edge->_vptr_Entity[4])(edge);
  if ((char)iVar6 == '\x02') {
    iVar6 = (*edge->_vptr_Entity[3])(edge);
    plVar9 = (long *)CONCAT44(extraout_var,iVar6);
    if (plVar9 == (long *)0x0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c0,"Invalid geometry!",0x11);
      pcVar2 = local_268 + 0x10;
      local_268._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"geo_ptr != nullptr","");
      pdVar1 = (PointerType)(local_2f0 + 0x10);
      local_2f0._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_268,(string *)local_2f0,0x1f6,(string *)local_2b8);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
      }
      if ((PointerType)local_2f0._0_8_ != pdVar1) {
        operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
      }
      if ((pointer)local_268._0_8_ != pcVar2) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      local_268._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"false","");
      local_2f0._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                 ,"");
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
      base::AssertionFailed((string *)local_268,(string *)local_2f0,0x1f6,(string *)local_2b8);
    }
    else {
      this_00 = &this->fe_precomp_;
      pQVar10 = PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
      (**(code **)(*plVar9 + 0x30))(&local_278,plVar9,&pQVar10->points_);
      uVar15 = local_270;
      pQVar10 = PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
      if (uVar15 == (uint)(pQVar10->points_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_cols) {
        sVar7 = PrecomputedScalarReferenceFiniteElement<double>::NumRefShapeFunctions(this_00);
        sVar8 = PrecomputedScalarReferenceFiniteElement<double>::NumRefShapeFunctions(this_00);
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_data = (double *)0x0;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_rows = 0;
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                  (&__return_storage_ptr__->
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(ulong)sVar7,
                   (ulong)sVar8);
        local_268._0_8_ = (pointer)0x0;
        Eigen::
        CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
        ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          *)local_1d0,
                         (__return_storage_ptr__->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                         .m_rows,(__return_storage_ptr__->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_cols,(scalar_constant_op<double> *)local_268);
        Eigen::internal::
        resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
                  (__return_storage_ptr__,
                   (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_1d0,(assign_op<double,_double> *)local_268);
        auVar5 = _DAT_0046a0a0;
        auVar4 = _DAT_0046a090;
        lVar14 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
                 * (__return_storage_ptr__->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_cols;
        if (0 < lVar14) {
          pdVar3 = (__return_storage_ptr__->
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_data;
          uVar15 = lVar14 + 0x1fffffffffffffff;
          uVar16 = uVar15 & 0x1fffffffffffffff;
          auVar17._8_4_ = (int)uVar16;
          auVar17._0_8_ = uVar16;
          auVar17._12_4_ = (int)(uVar16 >> 0x20);
          lVar14 = 0;
          auVar17 = auVar17 ^ _DAT_0046a0a0;
          do {
            auVar18._8_4_ = (int)lVar14;
            auVar18._0_8_ = lVar14;
            auVar18._12_4_ = (int)((ulong)lVar14 >> 0x20);
            auVar18 = (auVar18 | auVar4) ^ auVar5;
            if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                        auVar17._4_4_ < auVar18._4_4_) & 1)) {
              pdVar3[lVar14] = local_1c0.m_other;
            }
            if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
                auVar18._12_4_ <= auVar17._12_4_) {
              pdVar3[lVar14 + 1] = local_1c0.m_other;
            }
            lVar14 = lVar14 + 2;
          } while ((uVar16 - ((uint)uVar15 & 1)) + 2 != lVar14);
        }
        pQVar10 = PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_1f0,
                   (pQVar10->points_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
                   ,&(this->gamma_).value_,(allocator_type *)local_1d0);
        if (0 < (long)local_270) {
          lVar14 = 0;
          do {
            pQVar10 = PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
            pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 &pQVar10->weights_,lVar14);
            local_280 = *pdVar11;
            pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                                 &local_278,lVar14);
            local_280 = local_280 * *pdVar11 *
                        local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14];
            pMVar12 = PrecomputedScalarReferenceFiniteElement<double>::
                      PrecompReferenceShapeFunctions(this_00);
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                       local_2f0,pMVar12,lVar14);
            pMVar12 = PrecomputedScalarReferenceFiniteElement<double>::
                      PrecompReferenceShapeFunctions(this_00);
            Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                      ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                       local_2b8,pMVar12,lVar14);
            local_200 = local_288;
            local_210.m_value = local_298.m_value;
            vStack_208.m_value = vStack_290.m_value;
            local_220 = local_2a8._M_allocated_capacity;
            pMStack_218 = (XprTypeNested)local_2a8._8_8_;
            local_230 = (PointerType)local_2b8._0_8_;
            vStack_228.m_value = local_2b8._8_8_;
            local_268._0_8_ = local_2f0._0_8_;
            local_268._8_8_ = local_2f0._8_8_;
            local_268._16_8_ = local_2e0._M_allocated_capacity;
            local_268._24_8_ = local_2e0._8_8_;
            local_248.m_value = local_2d0.m_value;
            vStack_240.m_value = vStack_2c8.m_value;
            local_238 = local_2c0;
            local_1d8.m_other = local_280;
            Eigen::
            CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
            ::CwiseNullaryOp(&local_48,local_2f0._8_8_,local_2b8._8_8_,&local_1d8);
            Eigen::
            CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             *)local_1d0,(Lhs *)local_268,&local_48,&local_2f1);
            Eigen::internal::
            call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::add_assign_op<double,double>>
                      (__return_storage_ptr__,
                       (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)local_1d0,(add_assign_op<double,_double> *)&local_48);
            lVar14 = lVar14 + 1;
          } while (lVar14 < (long)local_270);
        }
        if (local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f0.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        free(local_278);
        return __return_storage_ptr__;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0,"Mismatch ",9);
      poVar13 = std::ostream::_M_insert<long>((long)&local_1c0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," <-> ",5);
      PrecomputedScalarReferenceFiniteElement<double>::Qr(this_00);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      pcVar2 = local_268 + 0x10;
      local_268._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"determinants.size() == fe_precomp_.Qr().NumPoints()","");
      pdVar1 = (PointerType)(local_2f0 + 0x10);
      local_2f0._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)local_268,(string *)local_2f0,0x1fd,(string *)local_2b8);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
      }
      if ((PointerType)local_2f0._0_8_ != pdVar1) {
        operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
      }
      if ((pointer)local_268._0_8_ != pcVar2) {
        operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
      }
      local_268._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"false","");
      local_2f0._0_8_ = pdVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
                 ,"");
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
      base::AssertionFailed((string *)local_268,(string *)local_2f0,0x1fd,(string *)local_2b8);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0,"Edge must be of segment type",0x1c);
    pcVar2 = local_268 + 0x10;
    local_268._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,"ref_el == lf::base::RefEl::kSegment()","");
    pdVar1 = (PointerType)(local_2f0 + 0x10);
    local_2f0._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_268,(string *)local_2f0,499,(string *)local_2b8);
    if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
      operator_delete((void *)local_2b8._0_8_,local_2a8._M_allocated_capacity + 1);
    }
    if ((PointerType)local_2f0._0_8_ != pdVar1) {
      operator_delete((void *)local_2f0._0_8_,local_2e0._M_allocated_capacity + 1);
    }
    if ((pointer)local_268._0_8_ != pcVar2) {
      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
    }
    local_268._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"false","");
    local_2f0._0_8_ = pdVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/loc_comp_ellbvp.h"
               ,"");
    local_2b8._0_8_ = local_2b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"");
    base::AssertionFailed((string *)local_268,(string *)local_2f0,499,(string *)local_2b8);
  }
  std::__cxx11::string::~string((string *)local_2b8);
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)local_268);
  abort();
}

Assistant:

typename MassEdgeMatrixProvider<SCALAR, COEFF, EDGESELECTOR>::ElemMat
MassEdgeMatrixProvider<SCALAR, COEFF, EDGESELECTOR>::Eval(
    const lf::mesh::Entity &edge) {
  // Topological type of the cell
  const lf::base::RefEl ref_el{edge.RefEl()};
  LF_ASSERT_MSG(ref_el == lf::base::RefEl::kSegment(),
                "Edge must be of segment type");
  // Query the shape of the edge
  const lf::geometry::Geometry *geo_ptr = edge.Geometry();
  LF_ASSERT_MSG(geo_ptr != nullptr, "Invalid geometry!");

  // Obtain the metric factors for the quadrature points
  const Eigen::VectorXd determinants(
      geo_ptr->IntegrationElement(fe_precomp_.Qr().Points()));
  LF_ASSERT_MSG(determinants.size() == fe_precomp_.Qr().NumPoints(),
                "Mismatch " << determinants.size() << " <-> "
                            << fe_precomp_.Qr().NumPoints());

  // Element matrix
  ElemMat mat(fe_precomp_.NumRefShapeFunctions(),
              fe_precomp_.NumRefShapeFunctions());
  mat.setZero();

  auto gammaval = gamma_(edge, fe_precomp_.Qr().Points());

  // Loop over quadrature points
  for (long k = 0; k < determinants.size(); ++k) {
    // Build local matrix by summing rank-1 contributions
    // from quadrature points.
    const auto w =
        (fe_precomp_.Qr().Weights()[k] * determinants[k]) * gammaval[k];
    mat += ((fe_precomp_.PrecompReferenceShapeFunctions().col(k)) *
            (fe_precomp_.PrecompReferenceShapeFunctions().col(k).adjoint())) *
           w;
  }
  return mat;
}